

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderApiTests.cpp
# Opt level: O1

void __thiscall deqp::gles3::Functional::ShaderSourceSplitCase::test(ShaderSourceSplitCase *this)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  deUint32 dVar5;
  long *plVar6;
  long lVar7;
  size_type *psVar8;
  ShaderSourceSplitCase *this_00;
  uint uVar9;
  char cVar10;
  ulong uVar11;
  int iVar12;
  string lastString;
  int lastStringLength;
  ShaderSources sources;
  string padding;
  Shader shader;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  int local_2ac;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2a8;
  vector<int,_std::allocator<int>_> vStack_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  ShaderSourceSplitCase *local_258;
  ulong local_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_248;
  ulong local_240;
  string local_238;
  undefined1 local_218 [8];
  _func_int **local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208 [6];
  ios_base local_1a0 [264];
  Shader local_98;
  
  local_248 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
                 m_log;
  vStack_290.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  vStack_290.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_2a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vStack_290.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (int *)0x0;
  local_2a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  glu::Shader::Shader(&local_98,((this->super_ApiCase).super_TestCase.m_context)->m_renderCtx,
                      this->m_shaderType);
  bVar1 = this->m_explicitLengths;
  generateFullSource_abi_cxx11_(&local_238,this);
  cVar10 = '\n';
  if (bVar1 == false) {
    cVar10 = '\0';
  }
  iVar12 = this->m_numSlices;
  uVar11 = (ulong)iVar12;
  local_240 = local_238._M_string_length;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar11;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_238._M_string_length;
  local_218 = (undefined1  [8])local_208;
  std::__cxx11::string::_M_construct((ulong)local_218,cVar10);
  local_258 = this;
  local_250 = uVar11;
  if (0 < iVar12) {
    do {
      std::__cxx11::string::substr((ulong)&local_278,(ulong)&local_238);
      plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_278,(ulong)local_218);
      psVar8 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_2d0.field_2._M_allocated_capacity = *psVar8;
        local_2d0.field_2._8_8_ = plVar6[3];
        local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
      }
      else {
        local_2d0.field_2._M_allocated_capacity = *psVar8;
        local_2d0._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_2d0._M_string_length = plVar6[1];
      *plVar6 = (long)psVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2a8,
                 &local_2d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
        operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
      if (bVar1 != false) {
        iVar12 = SUB164(auVar3 / auVar2,0);
        local_2d0._M_dataplus._M_p._0_4_ = iVar12;
        if (vStack_290.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_finish ==
            vStack_290.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&vStack_290,
                     (iterator)
                     vStack_290.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,(int *)&local_2d0);
        }
        else {
          *vStack_290.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = iVar12;
          vStack_290.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = vStack_290.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
      }
      uVar11 = uVar11 - 1;
    } while (uVar11 != 0);
  }
  this_00 = local_258;
  if (local_240 != SUB168(auVar3 / auVar2,0) * local_250) {
    std::__cxx11::string::substr((ulong)&local_2d0,(ulong)&local_238);
    local_2ac = (int)local_2d0._M_string_length;
    std::operator+(&local_278,&local_2d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2a8,
               &local_278);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    if (bVar1 != false) {
      if (vStack_290.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          vStack_290.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&vStack_290,
                   (iterator)
                   vStack_290.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_2ac);
      }
      else {
        *vStack_290.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_2ac;
        vStack_290.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = vStack_290.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
      operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_218 != (undefined1  [8])local_208) {
    operator_delete((void *)local_218,local_208[0]._M_allocated_capacity + 1);
  }
  if (this_00->m_randomNullTerm == true) {
    uVar4 = this_00->m_numSlices >> 2;
    uVar9 = 1;
    if (1 < (int)uVar4) {
      uVar9 = uVar4;
    }
    local_218 = (undefined1  [8])((ulong)local_218 & 0xffffffff00000000);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_2d0,
               (long)local_2a8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_2a8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5,
               (value_type_conflict1 *)local_218,(allocator_type *)&local_278);
    uVar4 = (uint)((ulong)((long)local_2a8.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_2a8.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 5);
    if (0 < (int)uVar4) {
      uVar11 = 0;
      do {
        *(int *)((long)local_2d0._M_dataplus._M_p + uVar11 * 4) = (int)uVar11;
        uVar11 = uVar11 + 1;
      } while ((uVar4 & 0x7fffffff) != uVar11);
    }
    de::Random::shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              (&this_00->m_rnd,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               local_2d0._M_dataplus._M_p,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               local_2d0._M_string_length);
    uVar11 = 0;
    do {
      iVar12 = *(int *)(local_2d0._M_dataplus._M_p + uVar11 * 4);
      std::__cxx11::string::substr
                ((ulong)local_218,
                 (ulong)(local_2a8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + iVar12));
      std::__cxx11::string::_M_assign
                ((string *)
                 (local_2a8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + iVar12));
      dVar5 = deRandom_getUint32(&(this_00->m_rnd).m_rnd);
      vStack_290.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar12] = dVar5 % 10 - 10;
      if (local_218 != (undefined1  [8])local_208) {
        operator_delete((void *)local_218,local_208[0]._M_allocated_capacity + 1);
      }
      uVar11 = uVar11 + 1;
    } while (uVar9 != uVar11);
    this_00 = local_258;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_2d0._M_dataplus._M_p,
                      local_2d0.field_2._M_allocated_capacity - (long)local_2d0._M_dataplus._M_p);
      this_00 = local_258;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  local_2d0._M_dataplus._M_p = (pointer)0x0;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_218,
             (long)local_2a8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_2a8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5,(value_type *)&local_2d0,
             (allocator_type *)&local_278);
  if (local_2a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_2a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar7 = 0;
    uVar11 = 0;
    do {
      *(undefined8 *)((long)local_218 + uVar11 * 8) =
           *(undefined8 *)
            ((long)&((local_2a8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar7);
      uVar11 = uVar11 + 1;
      lVar7 = lVar7 + 0x20;
    } while (uVar11 < (ulong)((long)local_2a8.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_2a8.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  iVar12 = (int)((ulong)((long)local_210 - (long)local_218) >> 3);
  if (vStack_290.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      vStack_290.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    glu::Shader::setSources(&local_98,iVar12,(char **)local_218,(int *)0x0);
  }
  else {
    glu::Shader::setSources
              (&local_98,iVar12,(char **)local_218,
               vStack_290.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start);
  }
  if (local_218 != (undefined1  [8])0x0) {
    operator_delete((void *)local_218,local_208[0]._M_allocated_capacity - (long)local_218);
  }
  glu::Shader::compile(&local_98);
  buildProgram(this_00,&local_98);
  if (local_98.m_info.compileOk == false) {
    local_218 = (undefined1  [8])local_248;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_210);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_210,"Compilation failed.",0x13);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_218,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_210);
    std::ios_base::~ios_base(local_1a0);
    tcu::TestContext::setTestResult
              ((this_00->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Compile failed");
  }
  glu::Shader::~Shader(&local_98);
  if (vStack_290.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(vStack_290.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)vStack_290.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)vStack_290.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2a8);
  return;
}

Assistant:

void test (void)
	{
		TestLog&			log			= m_testCtx.getLog();
		glu::RenderContext&	renderCtx	= m_context.getRenderContext();

		ShaderSources		sources;
		glu::Shader			shader		(renderCtx, m_shaderType);

		generateSources(sources);
		setShaderSources(shader, sources);
		shader.compile();

		buildProgram(shader);

		if (!shader.getCompileStatus())
		{
			log << TestLog::Message << "Compilation failed." << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Compile failed");
		}
	}